

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_asub_s_b_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  char cVar6;
  
  lVar2 = (ulong)wd * 0x10;
  lVar4 = (ulong)ws * 0x10;
  lVar3 = (ulong)wt * 0x10;
  iVar5 = (int)*(char *)((env->active_fpu).fpr + ws) - (int)*(char *)((env->active_fpu).fpr + wt);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((env->active_fpu).fpr + wd) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 1) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 1);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 1) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 2) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 2);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 2) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 3) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 3);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 3) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 4) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 4);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 4) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 5) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 5);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 5) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 6) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 6);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 6) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 7) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 7);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 7) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 8) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 8);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 8) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 9) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 9);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 9) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 10) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 10);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 10) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xb) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xb);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xb) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xc) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xd) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xd);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xd) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xe) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = cVar6;
  iVar5 = (int)*(char *)((long)(env->active_fpu).fpr + lVar4 + 0xf) -
          (int)*(char *)((long)(env->active_fpu).fpr + lVar3 + 0xf);
  cVar1 = (char)iVar5;
  cVar6 = -cVar1;
  if (0 < iVar5) {
    cVar6 = cVar1;
  }
  *(char *)((long)(env->active_fpu).fpr + lVar2 + 0xf) = cVar6;
  return;
}

Assistant:

void helper_msa_asub_s_b(CPUMIPSState *env,
                         uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_asub_s_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_asub_s_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_asub_s_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_asub_s_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_asub_s_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_asub_s_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_asub_s_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_asub_s_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_asub_s_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_asub_s_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_asub_s_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_asub_s_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_asub_s_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_asub_s_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_asub_s_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_asub_s_df(DF_BYTE, pws->b[15], pwt->b[15]);
}